

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeImplicitModuleImports(ExpressionContext *ctx)

{
  ByteCode *pBVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ModuleData **ppMVar5;
  undefined1 local_60 [8];
  TraceScope traceScope_1;
  ModuleData *moduleData;
  uint i_1;
  uint k_1;
  bool hasImplicitImport;
  uint k;
  undefined1 local_30 [3];
  bool hasImport;
  uint i;
  TraceScope traceScope;
  ExpressionContext *ctx_local;
  
  if ((AnalyzeImplicitModuleImports(ExpressionContext&)::token == '\0') &&
     (iVar3 = __cxa_guard_acquire(&AnalyzeImplicitModuleImports(ExpressionContext&)::token),
     iVar3 != 0)) {
    AnalyzeImplicitModuleImports::token =
         NULLC::TraceGetToken("analyze","AnalyzeImplicitModuleImports");
    __cxa_guard_release(&AnalyzeImplicitModuleImports(ExpressionContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_30,AnalyzeImplicitModuleImports::token);
  k = 0;
  do {
    uVar4 = SmallArray<ModuleData_*,_128U>::size(&ctx->uniqueDependencies);
    if (uVar4 <= k) {
      for (moduleData._0_4_ = 0; uVar4 = SmallArray<ModuleData_*,_128U>::size(&ctx->implicitImports)
          , (uint)moduleData < uVar4; moduleData._0_4_ = (uint)moduleData + 1) {
        ppMVar5 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->implicitImports,(uint)moduleData)
        ;
        traceScope_1._8_8_ = *ppMVar5;
        if ((AnalyzeImplicitModuleImports(ExpressionContext&)::token == '\0') &&
           (iVar3 = __cxa_guard_acquire(&AnalyzeImplicitModuleImports(ExpressionContext&)::token),
           iVar3 != 0)) {
          AnalyzeImplicitModuleImports(ExpressionContext&)::token =
               NULLC::TraceGetToken("analyze","AnalyzeImplicitModuleImport");
          __cxa_guard_release(&AnalyzeImplicitModuleImports(ExpressionContext&)::token);
        }
        NULLC::TraceScope::TraceScope
                  ((TraceScope *)local_60,AnalyzeImplicitModuleImports(ExpressionContext&)::token);
        NULLC::TraceLabel(*(char **)(traceScope_1._8_8_ + 8),*(char **)(traceScope_1._8_8_ + 0x10));
        ImportModule(ctx,*(SynBase **)traceScope_1._8_8_,*(ByteCode **)(traceScope_1._8_8_ + 0x20),
                     *(Lexeme **)(traceScope_1._8_8_ + 0x30),*(uint *)(traceScope_1._8_8_ + 0x38),
                     *(InplaceStr *)(traceScope_1._8_8_ + 8));
        NULLC::TraceScope::~TraceScope((TraceScope *)local_60);
      }
      NULLC::TraceScope::~TraceScope((TraceScope *)local_30);
      return;
    }
    bVar2 = false;
    for (k_1 = 0; uVar4 = SmallArray<ModuleData_*,_128U>::size(&ctx->imports), k_1 < uVar4;
        k_1 = k_1 + 1) {
      ppMVar5 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->imports,k_1);
      pBVar1 = (*ppMVar5)->bytecode;
      ppMVar5 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->uniqueDependencies,k);
      if (pBVar1 == (*ppMVar5)->bytecode) {
        bVar2 = true;
        break;
      }
    }
    if (!bVar2) {
      bVar2 = false;
      for (moduleData._4_4_ = 0; uVar4 = SmallArray<ModuleData_*,_128U>::size(&ctx->implicitImports)
          , moduleData._4_4_ < uVar4; moduleData._4_4_ = moduleData._4_4_ + 1) {
        ppMVar5 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->implicitImports,moduleData._4_4_)
        ;
        pBVar1 = (*ppMVar5)->bytecode;
        ppMVar5 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->uniqueDependencies,k);
        if (pBVar1 == (*ppMVar5)->bytecode) {
          bVar2 = true;
          break;
        }
      }
      if (!bVar2) {
        ppMVar5 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->uniqueDependencies,k);
        SmallArray<ModuleData_*,_128U>::push_back(&ctx->implicitImports,ppMVar5);
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

void AnalyzeImplicitModuleImports(ExpressionContext &ctx)
{
	TRACE_SCOPE("analyze", "AnalyzeImplicitModuleImports");

	// Find which transitive dependencies haven't been imported explicitly
	for(unsigned i = 0; i < ctx.uniqueDependencies.size(); i++)
	{
		bool hasImport = false;

		for(unsigned k = 0; k < ctx.imports.size(); k++)
		{
			if(ctx.imports[k]->bytecode == ctx.uniqueDependencies[i]->bytecode)
			{
				hasImport = true;
				break;
			}
		}

		if(hasImport)
			continue;

		bool hasImplicitImport = false;

		for(unsigned k = 0; k < ctx.implicitImports.size(); k++)
		{
			if(ctx.implicitImports[k]->bytecode == ctx.uniqueDependencies[i]->bytecode)
			{
				hasImplicitImport = true;
				break;
			}
		}

		if(hasImplicitImport)
			continue;

		ctx.implicitImports.push_back(ctx.uniqueDependencies[i]);
	}

	// Import additional modules
	for(unsigned i = 0; i < ctx.implicitImports.size(); i++)
	{
		ModuleData *moduleData = ctx.implicitImports[i];

		TRACE_SCOPE("analyze", "AnalyzeImplicitModuleImport");
		TRACE_LABEL2(moduleData->name.begin, moduleData->name.end);

		ImportModule(ctx, moduleData->source, moduleData->bytecode, moduleData->lexStream, moduleData->lexStreamSize, moduleData->name);
	}
}